

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall SQASTWritingVisitor::visitFunctionDecl(SQASTWritingVisitor *this,FunctionDecl *f)

{
  ArenaVector<SQCompilation::ParamDecl_*> *pAVar1;
  SQASTWritingVisitor *pSVar2;
  SQASTWritingVisitor *this_00;
  FunctionDecl *in_RSI;
  Node *in_RDI;
  ParamDecl **p;
  iterator __end1;
  iterator __begin1;
  ArenaVector<SQCompilation::ParamDecl_*> *__range1;
  undefined7 in_stack_ffffffffffffffa8;
  int8_t in_stack_ffffffffffffffaf;
  OutputStream *in_stack_ffffffffffffffb0;
  OutputStream *this_01;
  SQASTWritingVisitor *in_stack_ffffffffffffffb8;
  SQASTWritingVisitor *in_stack_ffffffffffffffd0;
  SQASTWritingVisitor *in_stack_ffffffffffffffd8;
  SQASTWritingVisitor *in_stack_ffffffffffffffe0;
  SQASTWritingVisitor *pSVar3;
  
  writeNodeHeader(in_stack_ffffffffffffffe0,(Node *)in_stack_ffffffffffffffd8);
  SQCompilation::FunctionDecl::name(in_RSI);
  writeString(in_stack_ffffffffffffffd8,(SQChar *)in_stack_ffffffffffffffd0);
  pAVar1 = SQCompilation::FunctionDecl::parameters(in_RSI);
  ArenaVector<SQCompilation::ParamDecl_*>::size(pAVar1);
  OutputStream::writeUInt64
            (in_stack_ffffffffffffffb0,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
            );
  pAVar1 = SQCompilation::FunctionDecl::parameters(in_RSI);
  pSVar2 = (SQASTWritingVisitor *)ArenaVector<SQCompilation::ParamDecl_*>::begin(pAVar1);
  this_00 = (SQASTWritingVisitor *)ArenaVector<SQCompilation::ParamDecl_*>::end(pAVar1);
  while (pSVar2 != this_00) {
    pSVar3 = pSVar2;
    SQCompilation::Node::visit<SQASTWritingVisitor>(in_RDI,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffd0 = pSVar2;
    pSVar2 = (SQASTWritingVisitor *)&pSVar3->stream;
  }
  SQCompilation::FunctionDecl::body(in_RSI);
  SQCompilation::Node::visit<SQASTWritingVisitor>(in_RDI,in_stack_ffffffffffffffb8);
  this_01 = *(OutputStream **)&in_RDI->_coordinates;
  SQCompilation::FunctionDecl::isVararg(in_RSI);
  OutputStream::writeInt8(this_01,in_stack_ffffffffffffffaf);
  SQCompilation::FunctionDecl::isLambda(in_RSI);
  OutputStream::writeInt8(this_01,in_stack_ffffffffffffffaf);
  SQCompilation::FunctionDecl::sourceName(in_RSI);
  writeString(this_00,(SQChar *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void SQASTWritingVisitor::visitFunctionDecl(FunctionDecl *f) {
  writeNodeHeader(f);

  writeString(f->name());

  stream->writeUInt64(f->parameters().size());

  for (auto &p : f->parameters()) {
    p->visit(this);
  }

  f->body()->visit(this);
  stream->writeInt8(f->isVararg());
  stream->writeInt8(f->isLambda());

  writeString(f->sourceName());
}